

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O1

float VW_Get_Weight(VW_HANDLE handle,size_t index,size_t offset)

{
  ulong i;
  weight *pwVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)((long)handle + 0x35a8);
  if (*(char *)((long)handle + 0x3590) != '\0') {
    pbVar2 = (byte *)((long)handle + 0x35f0);
  }
  i = (index & 0xffffffff) << (*pbVar2 & 0x3f);
  if (*(char *)((long)handle + 0x3590) == '\x01') {
    pwVar1 = sparse_parameters::operator[]((sparse_parameters *)((long)handle + 0x35b0),i);
  }
  else {
    pwVar1 = (weight *)
             ((i & *(ulong *)((long)handle + 0x35a0)) * 4 + *(long *)((long)handle + 0x3598));
  }
  return pwVar1[offset & 0xffffffff];
}

Assistant:

VW_DLL_MEMBER float VW_CALLING_CONV VW_Get_Weight(VW_HANDLE handle, size_t index, size_t offset)
{ vw* pointer = static_cast<vw*>(handle);
  return VW::get_weight(*pointer, (uint32_t) index, (uint32_t) offset);
}